

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  uint uVar11;
  uint uVar12;
  BYTE *op_1;
  ulong uVar13;
  BYTE *pBVar14;
  int *piVar15;
  seqDef *psVar16;
  byte bVar17;
  uint uVar18;
  U32 UVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  long *plVar23;
  long *plVar24;
  BYTE *pBVar25;
  uint uVar26;
  long lVar27;
  BYTE *ip;
  uint uVar28;
  BYTE *pStart_2;
  long *plVar29;
  ulong *puVar30;
  BYTE *pStart;
  ulong uVar31;
  U32 *hashTable;
  long *plVar32;
  long lVar33;
  int iVar34;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *base;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  
  pBVar9 = (ms->window).base;
  uVar12 = (ms->window).dictLimit;
  pBVar25 = pBVar9 + uVar12;
  puVar2 = (ulong *)((long)src + srcSize);
  uVar6 = *rep;
  uVar7 = rep[1];
  plVar29 = (long *)((ulong)((int)src == (int)pBVar25) + (long)src);
  uVar18 = (int)plVar29 - (int)pBVar25;
  uVar31 = (ulong)uVar7;
  if (uVar18 < uVar7) {
    uVar31 = 0;
  }
  uVar28 = (uint)uVar31;
  uVar26 = 0;
  if (uVar6 <= uVar18) {
    uVar26 = uVar6;
  }
  plVar32 = (long *)((long)src + (srcSize - 8));
  uVar8 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  iVar34 = (int)pBVar9;
  if (uVar8 == 5) {
    if (plVar29 < plVar32) {
      uVar8 = (ms->cParams).targetLength;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar3 = (ulong *)((long)puVar2 - 7);
      puVar4 = (ulong *)((long)puVar2 - 3);
      puVar5 = (ulong *)((long)puVar2 - 1);
      do {
        uVar13 = (ulong)(*plVar29 * -0x30e4432345000000) >> (bVar17 & 0x3f);
        uVar20 = (long)plVar29 - (long)pBVar9;
        uVar28 = pUVar10[uVar13];
        uVar21 = (ulong)uVar28;
        UVar19 = (U32)uVar20;
        pUVar10[uVar13] = UVar19;
        if (uVar26 == 0) {
LAB_0042abe8:
          if ((uVar12 < uVar28) && (piVar15 = (int *)(pBVar9 + uVar21), *piVar15 == (int)*plVar29))
          {
            puVar1 = (ulong *)((long)plVar29 + 4);
            puVar30 = (ulong *)(piVar15 + 1);
            puVar22 = puVar1;
            if (puVar1 < puVar3) {
              if (*puVar30 == *puVar1) {
                lVar27 = 0;
                do {
                  puVar30 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                  if (puVar3 <= puVar30) {
                    puVar30 = (ulong *)(pBVar9 + lVar27 + uVar21 + 0xc);
                    puVar22 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                    goto LAB_0042afad;
                  }
                  lVar33 = lVar27 + uVar21 + 0xc;
                  uVar31 = *puVar30;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar9 + lVar33) == uVar31);
                uVar31 = uVar31 ^ *(ulong *)(pBVar9 + lVar33);
                uVar13 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar31 = (uVar13 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar13 = *puVar1 ^ *puVar30;
                uVar31 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = uVar31 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0042afad:
              if ((puVar22 < puVar4) && ((int)*puVar30 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar22 < puVar5) && ((short)*puVar30 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar22 < puVar2) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar30 == (char)*puVar22));
              }
              uVar31 = (long)puVar22 - (long)puVar1;
            }
            lVar27 = uVar31 + 4;
            plVar24 = plVar29;
            if (src < plVar29) {
              pBVar14 = pBVar9 + (uVar21 - 1);
              do {
                plVar23 = (long *)((long)plVar24 + -1);
                if ((*(BYTE *)plVar23 != *pBVar14) ||
                   (lVar27 = lVar27 + 1, plVar24 = plVar23, pBVar14 <= pBVar25)) break;
                pBVar14 = pBVar14 + -1;
              } while (src < plVar23);
            }
            uVar28 = (int)plVar29 - (int)piVar15;
            uVar31 = (long)plVar24 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar29 = (long *)((long)plVar23 + uVar31);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar29);
            seqStore->lit = seqStore->lit + uVar31;
            if (uVar31 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar13 = lVar27 - 3;
            psVar16->litLength = (U16)uVar31;
            psVar16->offset = uVar28 + 3;
            uVar31 = (ulong)uVar26;
            uVar26 = uVar28;
            goto joined_r0x0042b0a5;
          }
          plVar29 = (long *)((long)plVar29 +
                            ((long)plVar29 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          plVar24 = (long *)((long)plVar29 + 1);
          if (*(int *)((long)plVar24 - (ulong)uVar26) != *(int *)((long)plVar29 + 1))
          goto LAB_0042abe8;
          lVar27 = -(ulong)uVar26;
          puVar1 = (ulong *)((long)plVar29 + 5);
          puVar22 = (ulong *)((long)plVar29 + lVar27 + 5);
          puVar30 = puVar1;
          if (puVar1 < puVar3) {
            if (*puVar22 == *puVar1) {
              lVar33 = 0;
              do {
                puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                if (puVar3 <= puVar30) {
                  puVar22 = (ulong *)((long)plVar29 + lVar27 + lVar33 + 0xd);
                  puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                  goto LAB_0042acae;
                }
                uVar13 = *(ulong *)((long)plVar29 + lVar33 + lVar27 + 0xd);
                uVar21 = *puVar30;
                lVar33 = lVar33 + 8;
              } while (uVar13 == uVar21);
              uVar21 = uVar21 ^ uVar13;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar21 = *puVar1 ^ *puVar22;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0042acae:
            if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar30 < puVar2) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
            }
            uVar13 = (long)puVar30 - (long)puVar1;
          }
          uVar21 = (long)plVar24 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar29 = (long *)((long)plVar23 + uVar21);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar29);
          seqStore->lit = seqStore->lit + uVar21;
          if (uVar21 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar27 = uVar13 + 4;
          uVar13 = uVar13 + 1;
          psVar16->litLength = (U16)uVar21;
          psVar16->offset = 1;
joined_r0x0042b0a5:
          if (0xffff < uVar13) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar27 + (long)plVar24);
          psVar16->matchLength = (U16)uVar13;
          seqStore->sequences = psVar16 + 1;
          plVar29 = (long *)src;
          if (src <= plVar32) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar20 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar17 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar34;
            uVar13 = (ulong)uVar26;
            do {
              uVar20 = uVar13;
              uVar13 = uVar31;
              plVar29 = (long *)src;
              uVar31 = uVar13;
              uVar26 = (uint)uVar20;
              if (((uint)uVar13 == 0) || ((int)*src != *(int *)((long)src - uVar13))) break;
              lVar27 = -uVar13;
              puVar1 = (ulong *)((long)src + 4);
              puVar22 = (ulong *)((long)src + lVar27 + 4);
              puVar30 = puVar1;
              if (puVar1 < puVar3) {
                if (*puVar22 == *puVar1) {
                  lVar33 = 0;
                  do {
                    puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                    if (puVar3 <= puVar30) {
                      puVar22 = (ulong *)((long)src + lVar27 + lVar33 + 0xc);
                      puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                      goto LAB_0042aeae;
                    }
                    uVar31 = *(ulong *)((long)src + lVar33 + lVar27 + 0xc);
                    uVar21 = *puVar30;
                    lVar33 = lVar33 + 8;
                  } while (uVar31 == uVar21);
                  uVar21 = uVar21 ^ uVar31;
                  uVar31 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar22;
                  uVar31 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = uVar31 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0042aeae:
                if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar30 < puVar2) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
                }
                uVar31 = (long)puVar30 - (long)puVar1;
              }
              pUVar10[(ulong)(*src * -0x30e4432345000000) >> (bVar17 & 0x3f)] = (int)src - iVar34;
              *(long *)seqStore->lit = *src;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar31 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar31 + 1);
              seqStore->sequences = psVar16 + 1;
              src = (void *)((long)src + uVar31 + 4);
              uVar31 = uVar20;
              plVar29 = (long *)src;
              uVar26 = (uint)uVar13;
            } while (src <= plVar32);
          }
        }
        uVar28 = (uint)uVar31;
      } while (plVar29 < plVar32);
    }
  }
  else if (uVar8 == 6) {
    if (plVar29 < plVar32) {
      uVar8 = (ms->cParams).targetLength;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar3 = (ulong *)((long)puVar2 - 7);
      puVar4 = (ulong *)((long)puVar2 - 3);
      puVar5 = (ulong *)((long)puVar2 - 1);
      do {
        uVar13 = (ulong)(*plVar29 * -0x30e4432340650000) >> (bVar17 & 0x3f);
        uVar20 = (long)plVar29 - (long)pBVar9;
        uVar28 = pUVar10[uVar13];
        uVar21 = (ulong)uVar28;
        UVar19 = (U32)uVar20;
        pUVar10[uVar13] = UVar19;
        if (uVar26 == 0) {
LAB_0042a63e:
          if ((uVar12 < uVar28) && (piVar15 = (int *)(pBVar9 + uVar21), *piVar15 == (int)*plVar29))
          {
            puVar1 = (ulong *)((long)plVar29 + 4);
            puVar30 = (ulong *)(piVar15 + 1);
            puVar22 = puVar1;
            if (puVar1 < puVar3) {
              if (*puVar30 == *puVar1) {
                lVar27 = 0;
                do {
                  puVar30 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                  if (puVar3 <= puVar30) {
                    puVar30 = (ulong *)(pBVar9 + lVar27 + uVar21 + 0xc);
                    puVar22 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                    goto LAB_0042a9d7;
                  }
                  lVar33 = lVar27 + uVar21 + 0xc;
                  uVar31 = *puVar30;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar9 + lVar33) == uVar31);
                uVar31 = uVar31 ^ *(ulong *)(pBVar9 + lVar33);
                uVar13 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar31 = (uVar13 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar13 = *puVar1 ^ *puVar30;
                uVar31 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = uVar31 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0042a9d7:
              if ((puVar22 < puVar4) && ((int)*puVar30 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar22 < puVar5) && ((short)*puVar30 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar22 < puVar2) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar30 == (char)*puVar22));
              }
              uVar31 = (long)puVar22 - (long)puVar1;
            }
            lVar27 = uVar31 + 4;
            plVar24 = plVar29;
            if (src < plVar29) {
              pBVar14 = pBVar9 + (uVar21 - 1);
              do {
                plVar23 = (long *)((long)plVar24 + -1);
                if ((*(BYTE *)plVar23 != *pBVar14) ||
                   (lVar27 = lVar27 + 1, plVar24 = plVar23, pBVar14 <= pBVar25)) break;
                pBVar14 = pBVar14 + -1;
              } while (src < plVar23);
            }
            uVar28 = (int)plVar29 - (int)piVar15;
            uVar31 = (long)plVar24 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar29 = (long *)((long)plVar23 + uVar31);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar29);
            seqStore->lit = seqStore->lit + uVar31;
            if (uVar31 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar13 = lVar27 - 3;
            psVar16->litLength = (U16)uVar31;
            psVar16->offset = uVar28 + 3;
            uVar31 = (ulong)uVar26;
            uVar26 = uVar28;
            goto joined_r0x0042aace;
          }
          plVar29 = (long *)((long)plVar29 +
                            ((long)plVar29 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          plVar24 = (long *)((long)plVar29 + 1);
          if (*(int *)((long)plVar24 - (ulong)uVar26) != *(int *)((long)plVar29 + 1))
          goto LAB_0042a63e;
          lVar27 = -(ulong)uVar26;
          puVar1 = (ulong *)((long)plVar29 + 5);
          puVar22 = (ulong *)((long)plVar29 + lVar27 + 5);
          puVar30 = puVar1;
          if (puVar1 < puVar3) {
            if (*puVar22 == *puVar1) {
              lVar33 = 0;
              do {
                puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                if (puVar3 <= puVar30) {
                  puVar22 = (ulong *)((long)plVar29 + lVar27 + lVar33 + 0xd);
                  puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                  goto LAB_0042a6fe;
                }
                uVar13 = *(ulong *)((long)plVar29 + lVar33 + lVar27 + 0xd);
                uVar21 = *puVar30;
                lVar33 = lVar33 + 8;
              } while (uVar13 == uVar21);
              uVar21 = uVar21 ^ uVar13;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar21 = *puVar1 ^ *puVar22;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0042a6fe:
            if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar30 < puVar2) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
            }
            uVar13 = (long)puVar30 - (long)puVar1;
          }
          uVar21 = (long)plVar24 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar29 = (long *)((long)plVar23 + uVar21);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar29);
          seqStore->lit = seqStore->lit + uVar21;
          if (uVar21 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar27 = uVar13 + 4;
          uVar13 = uVar13 + 1;
          psVar16->litLength = (U16)uVar21;
          psVar16->offset = 1;
joined_r0x0042aace:
          if (0xffff < uVar13) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar27 + (long)plVar24);
          psVar16->matchLength = (U16)uVar13;
          seqStore->sequences = psVar16 + 1;
          plVar29 = (long *)src;
          if (src <= plVar32) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar20 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar17 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar34;
            uVar13 = (ulong)uVar26;
            do {
              uVar20 = uVar13;
              uVar28 = (uint)uVar31;
              plVar29 = (long *)src;
              uVar26 = (uint)uVar20;
              if ((uVar28 == 0) || ((int)*src != *(int *)((long)src - uVar31))) break;
              lVar27 = -uVar31;
              puVar1 = (ulong *)((long)src + 4);
              puVar22 = (ulong *)((long)src + lVar27 + 4);
              puVar30 = puVar1;
              if (puVar1 < puVar3) {
                if (*puVar22 == *puVar1) {
                  lVar33 = 0;
                  do {
                    puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                    if (puVar3 <= puVar30) {
                      puVar22 = (ulong *)((long)src + lVar27 + lVar33 + 0xc);
                      puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                      goto LAB_0042a8e6;
                    }
                    uVar13 = *(ulong *)((long)src + lVar33 + lVar27 + 0xc);
                    uVar21 = *puVar30;
                    lVar33 = lVar33 + 8;
                  } while (uVar13 == uVar21);
                  uVar21 = uVar21 ^ uVar13;
                  uVar13 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar22;
                  uVar13 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  uVar13 = uVar13 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0042a8e6:
                if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar30 < puVar2) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
                }
                uVar13 = (long)puVar30 - (long)puVar1;
              }
              pUVar10[(ulong)(*src * -0x30e4432340650000) >> (bVar17 & 0x3f)] = (int)src - iVar34;
              *(long *)seqStore->lit = *src;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar13 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar13 + 1);
              seqStore->sequences = psVar16 + 1;
              src = (void *)((long)src + uVar13 + 4);
              uVar13 = uVar31;
              uVar31 = uVar20;
              plVar29 = (long *)src;
              uVar26 = uVar28;
            } while (src <= plVar32);
          }
        }
        uVar28 = (uint)uVar31;
      } while (plVar29 < plVar32);
    }
  }
  else if (uVar8 == 7) {
    if (plVar29 < plVar32) {
      uVar8 = (ms->cParams).targetLength;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar3 = (ulong *)((long)puVar2 - 7);
      puVar4 = (ulong *)((long)puVar2 - 3);
      puVar5 = (ulong *)((long)puVar2 - 1);
      do {
        uVar21 = (ulong)(*plVar29 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        uVar20 = (long)plVar29 - (long)pBVar9;
        uVar28 = pUVar10[uVar21];
        uVar13 = (ulong)uVar28;
        UVar19 = (U32)uVar20;
        pUVar10[uVar21] = UVar19;
        if (uVar26 == 0) {
LAB_0042a087:
          if ((uVar12 < uVar28) && (piVar15 = (int *)(pBVar9 + uVar13), *piVar15 == (int)*plVar29))
          {
            puVar1 = (ulong *)((long)plVar29 + 4);
            puVar30 = (ulong *)(piVar15 + 1);
            puVar22 = puVar1;
            if (puVar1 < puVar3) {
              if (*puVar30 == *puVar1) {
                lVar27 = 0;
                do {
                  puVar30 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                  if (puVar3 <= puVar30) {
                    puVar30 = (ulong *)(pBVar9 + lVar27 + uVar13 + 0xc);
                    puVar22 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                    goto LAB_0042a422;
                  }
                  lVar33 = lVar27 + uVar13 + 0xc;
                  uVar31 = *puVar30;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar9 + lVar33) == uVar31);
                uVar31 = uVar31 ^ *(ulong *)(pBVar9 + lVar33);
                uVar21 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar31 = (uVar21 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar21 = *puVar1 ^ *puVar30;
                uVar31 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = uVar31 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0042a422:
              if ((puVar22 < puVar4) && ((int)*puVar30 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar22 < puVar5) && ((short)*puVar30 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar22 < puVar2) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar30 == (char)*puVar22));
              }
              uVar31 = (long)puVar22 - (long)puVar1;
            }
            lVar27 = uVar31 + 4;
            plVar24 = plVar29;
            if (src < plVar29) {
              pBVar14 = pBVar9 + (uVar13 - 1);
              do {
                plVar23 = (long *)((long)plVar24 + -1);
                if ((*(BYTE *)plVar23 != *pBVar14) ||
                   (lVar27 = lVar27 + 1, plVar24 = plVar23, pBVar14 <= pBVar25)) break;
                pBVar14 = pBVar14 + -1;
              } while (src < plVar23);
            }
            uVar28 = (int)plVar29 - (int)piVar15;
            uVar31 = (long)plVar24 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar29 = (long *)((long)plVar23 + uVar31);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar29);
            seqStore->lit = seqStore->lit + uVar31;
            if (uVar31 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar13 = lVar27 - 3;
            psVar16->litLength = (U16)uVar31;
            psVar16->offset = uVar28 + 3;
            uVar31 = (ulong)uVar26;
            uVar26 = uVar28;
            goto joined_r0x0042a518;
          }
          plVar29 = (long *)((long)plVar29 +
                            ((long)plVar29 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
        }
        else {
          plVar24 = (long *)((long)plVar29 + 1);
          if (*(int *)((long)plVar24 - (ulong)uVar26) != *(int *)((long)plVar29 + 1))
          goto LAB_0042a087;
          lVar27 = -(ulong)uVar26;
          puVar1 = (ulong *)((long)plVar29 + 5);
          puVar22 = (ulong *)((long)plVar29 + lVar27 + 5);
          puVar30 = puVar1;
          if (puVar1 < puVar3) {
            if (*puVar22 == *puVar1) {
              lVar33 = 0;
              do {
                puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                if (puVar3 <= puVar30) {
                  puVar22 = (ulong *)((long)plVar29 + lVar27 + lVar33 + 0xd);
                  puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                  goto LAB_0042a149;
                }
                uVar13 = *(ulong *)((long)plVar29 + lVar33 + lVar27 + 0xd);
                uVar21 = *puVar30;
                lVar33 = lVar33 + 8;
              } while (uVar13 == uVar21);
              uVar21 = uVar21 ^ uVar13;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar21 = *puVar1 ^ *puVar22;
              uVar13 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0042a149:
            if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar30 < puVar2) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
            }
            uVar13 = (long)puVar30 - (long)puVar1;
          }
          uVar21 = (long)plVar24 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar29 = (long *)((long)plVar23 + uVar21);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar29);
          seqStore->lit = seqStore->lit + uVar21;
          if (uVar21 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar27 = uVar13 + 4;
          uVar13 = uVar13 + 1;
          psVar16->litLength = (U16)uVar21;
          psVar16->offset = 1;
joined_r0x0042a518:
          if (0xffff < uVar13) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar27 + (long)plVar24);
          psVar16->matchLength = (U16)uVar13;
          seqStore->sequences = psVar16 + 1;
          plVar29 = (long *)src;
          if (src <= plVar32) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar20 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar17 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                 ((int)src + -2) - iVar34;
            uVar13 = (ulong)uVar26;
            do {
              uVar20 = uVar13;
              uVar13 = uVar31;
              plVar29 = (long *)src;
              uVar31 = uVar13;
              uVar26 = (uint)uVar20;
              if (((uint)uVar13 == 0) || ((int)*src != *(int *)((long)src - uVar13))) break;
              lVar27 = -uVar13;
              puVar1 = (ulong *)((long)src + 4);
              puVar22 = (ulong *)((long)src + lVar27 + 4);
              puVar30 = puVar1;
              if (puVar1 < puVar3) {
                if (*puVar22 == *puVar1) {
                  lVar33 = 0;
                  do {
                    puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                    if (puVar3 <= puVar30) {
                      puVar22 = (ulong *)((long)src + lVar27 + lVar33 + 0xc);
                      puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                      goto LAB_0042a331;
                    }
                    uVar31 = *(ulong *)((long)src + lVar33 + lVar27 + 0xc);
                    uVar21 = *puVar30;
                    lVar33 = lVar33 + 8;
                  } while (uVar31 == uVar21);
                  uVar21 = uVar21 ^ uVar31;
                  uVar31 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar22;
                  uVar31 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = uVar31 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0042a331:
                if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
                  puVar30 = (ulong *)((long)puVar30 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar30 < puVar2) {
                  puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
                }
                uVar31 = (long)puVar30 - (long)puVar1;
              }
              pUVar10[(ulong)(*src * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] = (int)src - iVar34;
              *(long *)seqStore->lit = *src;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar31 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar31 + 1);
              seqStore->sequences = psVar16 + 1;
              src = (void *)((long)src + uVar31 + 4);
              uVar31 = uVar20;
              plVar29 = (long *)src;
              uVar26 = (uint)uVar13;
            } while (src <= plVar32);
          }
        }
        uVar28 = (uint)uVar31;
      } while (plVar29 < plVar32);
    }
  }
  else if (plVar29 < plVar32) {
    uVar8 = (ms->cParams).targetLength;
    bVar17 = 0x20 - (char)(ms->cParams).hashLog;
    puVar3 = (ulong *)((long)puVar2 - 7);
    puVar4 = (ulong *)((long)puVar2 - 3);
    puVar5 = (ulong *)((long)puVar2 - 1);
    do {
      uVar11 = (uint)((int)*plVar29 * -0x61c8864f) >> (bVar17 & 0x1f);
      uVar13 = (long)plVar29 - (long)pBVar9;
      uVar28 = pUVar10[uVar11];
      uVar20 = (ulong)uVar28;
      UVar19 = (U32)uVar13;
      pUVar10[uVar11] = UVar19;
      if (uVar26 == 0) {
LAB_0042b1ae:
        if ((uVar12 < uVar28) && (piVar15 = (int *)(pBVar9 + uVar20), *piVar15 == (int)*plVar29)) {
          puVar1 = (ulong *)((long)plVar29 + 4);
          puVar30 = (ulong *)(piVar15 + 1);
          puVar22 = puVar1;
          if (puVar1 < puVar3) {
            if (*puVar30 == *puVar1) {
              lVar27 = 0;
              do {
                puVar30 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                if (puVar3 <= puVar30) {
                  puVar30 = (ulong *)(pBVar9 + lVar27 + uVar20 + 0xc);
                  puVar22 = (ulong *)((long)plVar29 + lVar27 + 0xc);
                  goto LAB_0042b54c;
                }
                lVar33 = lVar27 + uVar20 + 0xc;
                uVar31 = *puVar30;
                lVar27 = lVar27 + 8;
              } while (*(ulong *)(pBVar9 + lVar33) == uVar31);
              uVar31 = uVar31 ^ *(ulong *)(pBVar9 + lVar33);
              uVar21 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar31 = (uVar21 >> 3 & 0x1fffffff) + lVar27;
            }
            else {
              uVar21 = *puVar1 ^ *puVar30;
              uVar31 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = uVar31 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0042b54c:
            if ((puVar22 < puVar4) && ((int)*puVar30 == (int)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 4);
              puVar30 = (ulong *)((long)puVar30 + 4);
            }
            if ((puVar22 < puVar5) && ((short)*puVar30 == (short)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 2);
              puVar30 = (ulong *)((long)puVar30 + 2);
            }
            if (puVar22 < puVar2) {
              puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar30 == (char)*puVar22));
            }
            uVar31 = (long)puVar22 - (long)puVar1;
          }
          lVar27 = uVar31 + 4;
          plVar24 = plVar29;
          if (src < plVar29) {
            pBVar14 = pBVar9 + (uVar20 - 1);
            do {
              plVar23 = (long *)((long)plVar24 + -1);
              if ((*(BYTE *)plVar23 != *pBVar14) ||
                 (lVar27 = lVar27 + 1, plVar24 = plVar23, pBVar14 <= pBVar25)) break;
              pBVar14 = pBVar14 + -1;
            } while (src < plVar23);
          }
          uVar28 = (int)plVar29 - (int)piVar15;
          uVar31 = (long)plVar24 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar29 = (long *)((long)plVar23 + uVar31);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar29);
          seqStore->lit = seqStore->lit + uVar31;
          if (uVar31 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar20 = lVar27 - 3;
          psVar16->litLength = (U16)uVar31;
          psVar16->offset = uVar28 + 3;
          uVar31 = (ulong)uVar26;
          uVar26 = uVar28;
          goto joined_r0x0042b645;
        }
        plVar29 = (long *)((long)plVar29 +
                          ((long)plVar29 - (long)src >> 8) + (ulong)(uVar8 + (uVar8 == 0)));
      }
      else {
        plVar24 = (long *)((long)plVar29 + 1);
        if (*(int *)((long)plVar24 - (ulong)uVar26) != *(int *)((long)plVar29 + 1))
        goto LAB_0042b1ae;
        lVar27 = -(ulong)uVar26;
        puVar1 = (ulong *)((long)plVar29 + 5);
        puVar22 = (ulong *)((long)plVar29 + lVar27 + 5);
        puVar30 = puVar1;
        if (puVar1 < puVar3) {
          if (*puVar22 == *puVar1) {
            lVar33 = 0;
            do {
              puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
              if (puVar3 <= puVar30) {
                puVar22 = (ulong *)((long)plVar29 + lVar27 + lVar33 + 0xd);
                puVar30 = (ulong *)((long)plVar29 + lVar33 + 0xd);
                goto LAB_0042b270;
              }
              uVar20 = *(ulong *)((long)plVar29 + lVar33 + lVar27 + 0xd);
              uVar21 = *puVar30;
              lVar33 = lVar33 + 8;
            } while (uVar20 == uVar21);
            uVar21 = uVar21 ^ uVar20;
            uVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar33;
          }
          else {
            uVar21 = *puVar1 ^ *puVar22;
            uVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0042b270:
          if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
            puVar30 = (ulong *)((long)puVar30 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
            puVar30 = (ulong *)((long)puVar30 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar30 < puVar2) {
            puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
          }
          uVar20 = (long)puVar30 - (long)puVar1;
        }
        uVar21 = (long)plVar24 - (long)src;
        plVar23 = (long *)seqStore->lit;
        plVar29 = (long *)((long)plVar23 + uVar21);
        do {
          *plVar23 = *src;
          plVar23 = plVar23 + 1;
          src = (void *)((long)src + 8);
        } while (plVar23 < plVar29);
        seqStore->lit = seqStore->lit + uVar21;
        if (uVar21 < 0x10000) {
          psVar16 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar16 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar27 = uVar20 + 4;
        uVar20 = uVar20 + 1;
        psVar16->litLength = (U16)uVar21;
        psVar16->offset = 1;
joined_r0x0042b645:
        if (0xffff < uVar20) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar27 + (long)plVar24);
        psVar16->matchLength = (U16)uVar20;
        seqStore->sequences = psVar16 + 1;
        plVar29 = (long *)src;
        if (src <= plVar32) {
          pUVar10[(uint)(*(int *)(pBVar9 + (uVar13 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar17 & 0x1f)] = UVar19 + 2;
          pUVar10[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)src + -2) - iVar34;
          uVar13 = (ulong)uVar26;
          do {
            uVar20 = uVar13;
            uVar13 = uVar31;
            plVar29 = (long *)src;
            uVar31 = uVar13;
            uVar26 = (uint)uVar20;
            if (((uint)uVar13 == 0) || ((int)*src != *(int *)((long)src - uVar13))) break;
            lVar27 = -uVar13;
            puVar1 = (ulong *)((long)src + 4);
            puVar22 = (ulong *)((long)src + lVar27 + 4);
            puVar30 = puVar1;
            if (puVar1 < puVar3) {
              if (*puVar22 == *puVar1) {
                lVar33 = 0;
                do {
                  puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                  if (puVar3 <= puVar30) {
                    puVar22 = (ulong *)((long)src + lVar27 + lVar33 + 0xc);
                    puVar30 = (ulong *)((long)src + lVar33 + 0xc);
                    goto LAB_0042b45d;
                  }
                  uVar31 = *(ulong *)((long)src + lVar33 + lVar27 + 0xc);
                  uVar21 = *puVar30;
                  lVar33 = lVar33 + 8;
                } while (uVar31 == uVar21);
                uVar21 = uVar21 ^ uVar31;
                uVar31 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar21 = *puVar1 ^ *puVar22;
                uVar31 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = uVar31 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0042b45d:
              if ((puVar30 < puVar4) && ((int)*puVar22 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar30 < puVar5) && ((short)*puVar22 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar30 < puVar2) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
              }
              uVar31 = (long)puVar30 - (long)puVar1;
            }
            pUVar10[(uint)((int)*src * -0x61c8864f) >> (bVar17 & 0x1f)] = (int)src - iVar34;
            *(long *)seqStore->lit = *src;
            psVar16 = seqStore->sequences;
            psVar16->litLength = 0;
            psVar16->offset = 1;
            if (0xffff < uVar31 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar16->matchLength = (U16)(uVar31 + 1);
            seqStore->sequences = psVar16 + 1;
            src = (void *)((long)src + uVar31 + 4);
            uVar31 = uVar20;
            plVar29 = (long *)src;
            uVar26 = (uint)uVar13;
          } while (src <= plVar32);
        }
      }
      uVar28 = (uint)uVar31;
    } while (plVar29 < plVar32);
  }
  uVar12 = 0;
  if (uVar18 < uVar7) {
    uVar12 = uVar7;
  }
  if (uVar18 < uVar6) {
    uVar12 = uVar6;
  }
  if (uVar26 == 0) {
    uVar26 = uVar12;
  }
  if (uVar28 != 0) {
    uVar12 = uVar28;
  }
  *rep = uVar26;
  rep[1] = uVar12;
  return (long)puVar2 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}